

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void gen_hermite_ek_compute(int n,double alpha,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *e;
  double dVar3;
  double dVar4;
  double zemu;
  double i_r8;
  int i;
  double *bj;
  double *w_local;
  double *x_local;
  double alpha_local;
  int n_local;
  
  dVar3 = tgamma((alpha + 1.0) / 2.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  e = (double *)operator_new__(uVar2);
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    if (i_r8._4_4_ % 2 == 0) {
      e[i_r8._4_4_] = ((double)(i_r8._4_4_ + 1) + alpha) / 2.0;
    }
    else {
      e[i_r8._4_4_] = (double)(i_r8._4_4_ + 1) / 2.0;
    }
  }
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    dVar4 = sqrt(e[i_r8._4_4_]);
    e[i_r8._4_4_] = dVar4;
  }
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    x[i_r8._4_4_] = 0.0;
  }
  dVar3 = sqrt(dVar3);
  *w = dVar3;
  for (i_r8._4_4_ = 1; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    w[i_r8._4_4_] = 0.0;
  }
  imtqlx(n,x,e,w);
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    w[i_r8._4_4_] = w[i_r8._4_4_] * w[i_r8._4_4_];
  }
  if (e != (double *)0x0) {
    operator_delete__(e);
  }
  return;
}

Assistant:

void gen_hermite_ek_compute ( int n, double alpha, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_HERMITE_EK_COMPUTE computes a generalized Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The code uses an algorithm by Elhay and Kautsky.
//
//    The integral:
//
//      integral ( -oo < x < +oo ) |x|^alpha exp(-x^2) f(x) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the number of abscissas.
//
//    Input, double ALPHA, the parameter.
//    -1.0 < ALPHA.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *bj;
  int i;
  double i_r8;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = tgamma ( ( alpha + 1.0 ) / 2.0 );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    i_r8 = double( i + 1 );
    if ( ( i % 2 ) == 0 )
    {
      bj[i] = ( i_r8 + alpha ) / 2.0;
    }
    else
    {
      bj[i] = i_r8 / 2.0;
    }
  }

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( bj[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = 0.0;
  }

  w[0] = sqrt ( zemu );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}